

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSConverter.cpp
# Opt level: O0

void __thiscall
Assimp::Discreet3DSImporter::ConvertMaterial
          (Discreet3DSImporter *this,Material *oldMat,aiMaterial *mat)

{
  long lVar1;
  undefined1 local_c74 [8];
  aiString tex_1;
  int eShading_;
  uint iWire;
  aiShadingMode eShading;
  int i;
  aiString name;
  allocator<char> local_449;
  string local_448 [36];
  undefined1 local_424 [8];
  aiString tex;
  aiMaterial *mat_local;
  Material *oldMat_local;
  Discreet3DSImporter *this_local;
  
  tex.data._1016_8_ = mat;
  lVar1 = std::__cxx11::string::length();
  if ((lVar1 != 0) && ((this->bHasBG & 1U) != 0)) {
    aiString::aiString((aiString *)local_424);
    aiString::Set((aiString *)local_424,&this->mBackgroundImage);
    aiMaterial::AddProperty((aiMaterial *)tex.data._1016_8_,(aiString *)local_424,"?bg.global",0,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_448,"",&local_449);
    std::__cxx11::string::operator=((string *)&this->mBackgroundImage,local_448);
    std::__cxx11::string::~string(local_448);
    std::allocator<char>::~allocator(&local_449);
  }
  (oldMat->mAmbient).r = (this->mClrAmbient).r + (oldMat->mAmbient).r;
  (oldMat->mAmbient).g = (this->mClrAmbient).g + (oldMat->mAmbient).g;
  (oldMat->mAmbient).b = (this->mClrAmbient).b + (oldMat->mAmbient).b;
  aiString::aiString((aiString *)&eShading);
  aiString::Set((aiString *)&eShading,&oldMat->mName);
  aiMaterial::AddProperty((aiMaterial *)tex.data._1016_8_,(aiString *)&eShading,"?mat.name",0,0);
  aiMaterial::AddProperty((aiMaterial *)tex.data._1016_8_,&oldMat->mAmbient,1,"$clr.ambient",0,0);
  aiMaterial::AddProperty((aiMaterial *)tex.data._1016_8_,&oldMat->mDiffuse,1,"$clr.diffuse",0,0);
  aiMaterial::AddProperty((aiMaterial *)tex.data._1016_8_,&oldMat->mSpecular,1,"$clr.specular",0,0);
  aiMaterial::AddProperty((aiMaterial *)tex.data._1016_8_,&oldMat->mEmissive,1,"$clr.emissive",0,0);
  if ((oldMat->mShading == Phong) || (oldMat->mShading == Metal)) {
    if (((oldMat->mSpecularExponent == 0.0) && (!NAN(oldMat->mSpecularExponent))) ||
       ((oldMat->mShininessStrength == 0.0 && (!NAN(oldMat->mShininessStrength))))) {
      oldMat->mShading = Gouraud;
    }
    else {
      aiMaterial::AddProperty
                ((aiMaterial *)tex.data._1016_8_,&oldMat->mSpecularExponent,1,"$mat.shininess",0,0);
      aiMaterial::AddProperty
                ((aiMaterial *)tex.data._1016_8_,&oldMat->mShininessStrength,1,"$mat.shinpercent",0,
                 0);
    }
  }
  aiMaterial::AddProperty<float>
            ((aiMaterial *)tex.data._1016_8_,&oldMat->mTransparency,1,"$mat.opacity",0,0);
  aiMaterial::AddProperty<float>
            ((aiMaterial *)tex.data._1016_8_,&oldMat->mBumpHeight,1,"$mat.bumpscaling",0,0);
  if ((oldMat->mTwoSided & 1U) != 0) {
    iWire = 1;
    aiMaterial::AddProperty<int>
              ((aiMaterial *)tex.data._1016_8_,(int *)&iWire,1,"$mat.twosided",0,0);
  }
  eShading_ = 9;
  switch(oldMat->mShading) {
  case Wire:
    tex_1.data[0x3fc] = '\x01';
    tex_1.data[0x3fd] = '\0';
    tex_1.data[0x3fe] = '\0';
    tex_1.data[0x3ff] = '\0';
    aiMaterial::AddProperty<int>
              ((aiMaterial *)tex.data._1016_8_,(int *)(tex_1.data + 0x3fc),1,"$mat.wireframe",0,0);
  case Gouraud:
    eShading_ = 2;
    break;
  case Flat:
    eShading_ = 1;
    break;
  case Phong:
    eShading_ = 3;
    break;
  case Metal:
    eShading_ = 8;
    break;
  case Blinn:
    eShading_ = 4;
  }
  tex_1.data[0x3f8] = (undefined1)eShading_;
  tex_1.data[0x3f9] = eShading_._1_1_;
  tex_1.data[0x3fa] = eShading_._2_1_;
  tex_1.data[0x3fb] = eShading_._3_1_;
  aiMaterial::AddProperty<int>
            ((aiMaterial *)tex.data._1016_8_,(int *)(tex_1.data + 0x3f8),1,"$mat.shadingm",0,0);
  lVar1 = std::__cxx11::string::length();
  if (lVar1 != 0) {
    CopyTexture((aiMaterial *)tex.data._1016_8_,&oldMat->sTexDiffuse,aiTextureType_DIFFUSE);
  }
  lVar1 = std::__cxx11::string::length();
  if (lVar1 != 0) {
    CopyTexture((aiMaterial *)tex.data._1016_8_,&oldMat->sTexSpecular,aiTextureType_SPECULAR);
  }
  lVar1 = std::__cxx11::string::length();
  if (lVar1 != 0) {
    CopyTexture((aiMaterial *)tex.data._1016_8_,&oldMat->sTexOpacity,aiTextureType_OPACITY);
  }
  lVar1 = std::__cxx11::string::length();
  if (lVar1 != 0) {
    CopyTexture((aiMaterial *)tex.data._1016_8_,&oldMat->sTexEmissive,aiTextureType_EMISSIVE);
  }
  lVar1 = std::__cxx11::string::length();
  if (lVar1 != 0) {
    CopyTexture((aiMaterial *)tex.data._1016_8_,&oldMat->sTexBump,aiTextureType_HEIGHT);
  }
  lVar1 = std::__cxx11::string::length();
  if (lVar1 != 0) {
    CopyTexture((aiMaterial *)tex.data._1016_8_,&oldMat->sTexShininess,aiTextureType_SHININESS);
  }
  lVar1 = std::__cxx11::string::length();
  if (lVar1 != 0) {
    CopyTexture((aiMaterial *)tex.data._1016_8_,&oldMat->sTexReflective,aiTextureType_REFLECTION);
  }
  lVar1 = std::__cxx11::string::length();
  if (lVar1 != 0) {
    aiString::aiString((aiString *)local_c74);
    aiString::Set((aiString *)local_c74,&oldMat->mName);
    aiMaterial::AddProperty((aiMaterial *)tex.data._1016_8_,(aiString *)local_c74,"?mat.name",0,0);
  }
  return;
}

Assistant:

void Discreet3DSImporter::ConvertMaterial(D3DS::Material& oldMat,
    aiMaterial& mat)
{
    // NOTE: Pass the background image to the viewer by bypassing the
    // material system. This is an evil hack, never do it again!
    if (0 != mBackgroundImage.length() && bHasBG)
    {
        aiString tex;
        tex.Set( mBackgroundImage);
        mat.AddProperty( &tex, AI_MATKEY_GLOBAL_BACKGROUND_IMAGE);

        // Be sure this is only done for the first material
        mBackgroundImage = std::string("");
    }

    // At first add the base ambient color of the scene to the material
    oldMat.mAmbient.r += mClrAmbient.r;
    oldMat.mAmbient.g += mClrAmbient.g;
    oldMat.mAmbient.b += mClrAmbient.b;

    aiString name;
    name.Set( oldMat.mName);
    mat.AddProperty( &name, AI_MATKEY_NAME);

    // Material colors
    mat.AddProperty( &oldMat.mAmbient, 1, AI_MATKEY_COLOR_AMBIENT);
    mat.AddProperty( &oldMat.mDiffuse, 1, AI_MATKEY_COLOR_DIFFUSE);
    mat.AddProperty( &oldMat.mSpecular, 1, AI_MATKEY_COLOR_SPECULAR);
    mat.AddProperty( &oldMat.mEmissive, 1, AI_MATKEY_COLOR_EMISSIVE);

    // Phong shininess and shininess strength
    if (D3DS::Discreet3DS::Phong == oldMat.mShading ||
        D3DS::Discreet3DS::Metal == oldMat.mShading)
    {
        if (!oldMat.mSpecularExponent || !oldMat.mShininessStrength)
        {
            oldMat.mShading = D3DS::Discreet3DS::Gouraud;
        }
        else
        {
            mat.AddProperty( &oldMat.mSpecularExponent, 1, AI_MATKEY_SHININESS);
            mat.AddProperty( &oldMat.mShininessStrength, 1, AI_MATKEY_SHININESS_STRENGTH);
        }
    }

    // Opacity
    mat.AddProperty<ai_real>( &oldMat.mTransparency,1,AI_MATKEY_OPACITY);

    // Bump height scaling
    mat.AddProperty<ai_real>( &oldMat.mBumpHeight,1,AI_MATKEY_BUMPSCALING);

    // Two sided rendering?
    if (oldMat.mTwoSided)
    {
        int i = 1;
        mat.AddProperty<int>(&i,1,AI_MATKEY_TWOSIDED);
    }

    // Shading mode
    aiShadingMode eShading = aiShadingMode_NoShading;
    switch (oldMat.mShading)
    {
        case D3DS::Discreet3DS::Flat:
            eShading = aiShadingMode_Flat; break;

        // I don't know what "Wire" shading should be,
        // assume it is simple lambertian diffuse shading
        case D3DS::Discreet3DS::Wire:
            {
                // Set the wireframe flag
                unsigned int iWire = 1;
                mat.AddProperty<int>( (int*)&iWire,1,AI_MATKEY_ENABLE_WIREFRAME);
            }

        case D3DS::Discreet3DS::Gouraud:
            eShading = aiShadingMode_Gouraud; break;

        // assume cook-torrance shading for metals.
        case D3DS::Discreet3DS::Phong :
            eShading = aiShadingMode_Phong; break;

        case D3DS::Discreet3DS::Metal :
            eShading = aiShadingMode_CookTorrance; break;

            // FIX to workaround a warning with GCC 4 who complained
            // about a missing case Blinn: here - Blinn isn't a valid
            // value in the 3DS Loader, it is just needed for ASE
        case D3DS::Discreet3DS::Blinn :
            eShading = aiShadingMode_Blinn; break;
    }
    int eShading_ = static_cast<int>(eShading);
    mat.AddProperty<int>(&eShading_, 1, AI_MATKEY_SHADING_MODEL);

    // DIFFUSE texture
    if( oldMat.sTexDiffuse.mMapName.length() > 0)
        CopyTexture(mat,oldMat.sTexDiffuse, aiTextureType_DIFFUSE);

    // SPECULAR texture
    if( oldMat.sTexSpecular.mMapName.length() > 0)
        CopyTexture(mat,oldMat.sTexSpecular, aiTextureType_SPECULAR);

    // OPACITY texture
    if( oldMat.sTexOpacity.mMapName.length() > 0)
        CopyTexture(mat,oldMat.sTexOpacity, aiTextureType_OPACITY);

    // EMISSIVE texture
    if( oldMat.sTexEmissive.mMapName.length() > 0)
        CopyTexture(mat,oldMat.sTexEmissive, aiTextureType_EMISSIVE);

    // BUMP texture
    if( oldMat.sTexBump.mMapName.length() > 0)
        CopyTexture(mat,oldMat.sTexBump, aiTextureType_HEIGHT);

    // SHININESS texture
    if( oldMat.sTexShininess.mMapName.length() > 0)
        CopyTexture(mat,oldMat.sTexShininess, aiTextureType_SHININESS);

    // REFLECTION texture
    if( oldMat.sTexReflective.mMapName.length() > 0)
        CopyTexture(mat,oldMat.sTexReflective, aiTextureType_REFLECTION);

    // Store the name of the material itself, too
    if( oldMat.mName.length())  {
        aiString tex;
        tex.Set( oldMat.mName);
        mat.AddProperty( &tex, AI_MATKEY_NAME);
    }
}